

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O1

void __thiscall FIX::IOException::IOException(IOException *this,string *what)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"IO Error","");
  FIX::Exception::Exception(&this->super_Exception,&local_40,what);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_001f8ca0;
  return;
}

Assistant:

IOException(const std::string &what = "")
      : Exception("IO Error", what) {}